

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fxam_ST0_x86_64(CPUX86State *env)

{
  ushort uVar1;
  undefined2 uVar2;
  uint64_t uVar3;
  ushort uVar4;
  ushort uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)env->fpstt;
  uVar3 = env->fpregs[uVar6].d.low;
  uVar1 = *(ushort *)((long)env->fpregs + uVar6 * 0x10 + 8);
  uVar2 = env->fpus;
  uVar4 = uVar1 >> 6 & 0x200 | uVar2 & 0xb8ff;
  env->fpus = uVar4;
  uVar5 = 0x4100;
  if (env->fptags[uVar6] == '\0') {
    if ((uVar1 & 0x7fff) == 0) {
      uVar5 = (uVar3 != 0 | 0x10) << 10;
    }
    else {
      uVar5 = 0x400;
      if ((uVar1 & 0x7fff) == 0x7fff) {
        uVar5 = 0x100;
      }
    }
  }
  env->fpus = uVar5 | uVar4;
  return;
}

Assistant:

void helper_fxam_ST0(CPUX86State *env)
{
    CPU_LDoubleU temp;
    int expdif;

    temp.d = ST0;

    env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
    if (SIGND(temp)) {
        env->fpus |= 0x200; /* C1 <-- 1 */
    }

    if (env->fptags[env->fpstt]) {
        env->fpus |= 0x4100; /* Empty */
        return;
    }

    expdif = EXPD(temp);
    if (expdif == MAXEXPD) {
        if (MANTD(temp) == 0x8000000000000000ULL) {
            env->fpus |= 0x500; /* Infinity */
        } else {
            env->fpus |= 0x100; /* NaN */
        }
    } else if (expdif == 0) {
        if (MANTD(temp) == 0) {
            env->fpus |=  0x4000; /* Zero */
        } else {
            env->fpus |= 0x4400; /* Denormal */
        }
    } else {
        env->fpus |= 0x400;
    }
}